

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

int __thiscall CTPNStmTry::gen_code_break(CTPNStmTry *this,textchar_t *lbl,size_t lbl_len)

{
  CTPNStmTry *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  gen_jsr_finally(in_RDX);
  if (*(long *)(in_RDI + 0x20) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(**(long **)(in_RDI + 0x20) + 0xf8))
                        (*(long **)(in_RDI + 0x20),in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

int CTPNStmTry::gen_code_break(const textchar_t *lbl, size_t lbl_len)
{
    /* if we have a 'finally' block, invoke it as a local subroutine call */
    gen_jsr_finally();

    /* 
     *   If there's an enclosing statement, let it generate the break; if
     *   there's not, return failure, because we're not a meaningful
     *   target for break.
     */
    if (enclosing_)
        return enclosing_->gen_code_break(lbl, lbl_len);
    else
        return FALSE;
}